

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

int __thiscall FNodeBuilder::FVertexMap::InsertVertex(FVertexMap *this,FPrivVert *vert)

{
  FPrivVert *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FNodeBuilder *pFVar7;
  DWORD DVar8;
  DWORD DVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int i;
  long lVar16;
  TArray<int,_int> *pTVar17;
  uint blkcount [4];
  int blk [4];
  uint local_48 [4];
  int local_38 [6];
  
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  pFVar7 = this->MyBuilder;
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Grow(&pFVar7->Vertices,1);
  DVar8 = vert->segs;
  DVar9 = vert->segs2;
  pFVar1 = (pFVar7->Vertices).Array + (pFVar7->Vertices).Count;
  pFVar1->super_FSimpleVert = vert->super_FSimpleVert;
  pFVar1->segs = DVar8;
  pFVar1->segs2 = DVar9;
  uVar2 = (pFVar7->Vertices).Count;
  (pFVar7->Vertices).Count = uVar2 + 1;
  iVar3 = this->MinX;
  iVar4 = this->MinY;
  iVar12 = (vert->super_FSimpleVert).x;
  iVar10 = iVar12 + -6;
  if (iVar10 < iVar3) {
    iVar10 = iVar3;
  }
  iVar15 = (vert->super_FSimpleVert).y;
  iVar5 = this->MaxX;
  iVar12 = iVar12 + 6;
  if (iVar5 < iVar12) {
    iVar12 = iVar5;
  }
  iVar14 = iVar15 + -6;
  if (iVar14 < iVar4) {
    iVar14 = iVar4;
  }
  iVar6 = this->MaxY;
  iVar15 = iVar15 + 6;
  if (iVar6 < iVar15) {
    iVar15 = iVar6;
  }
  if (iVar5 < iVar10) {
    __assert_fail("x <= MaxX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild.h"
                  ,0x9f,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  if (iVar6 < iVar14) {
    __assert_fail("y <= MaxY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild.h"
                  ,0xa0,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  uVar11 = (uint)(iVar10 - iVar3) >> 0x18;
  local_38[1] = ((uint)(iVar14 - iVar4) >> 0x18) * this->BlocksWide;
  local_38[0] = local_38[1] + uVar11;
  if (iVar3 <= iVar12) {
    uVar13 = (uint)(iVar12 - iVar3) >> 0x18;
    local_38[1] = local_38[1] + uVar13;
    if (iVar4 <= iVar15) {
      local_38[3] = this->BlocksWide * ((uint)(iVar15 - iVar4) >> 0x18);
      local_38[2] = uVar11 + local_38[3];
      local_38[3] = local_38[3] + uVar13;
      pTVar17 = this->VertexGrid;
      local_48[0] = pTVar17[local_38[0]].Count;
      local_48[1] = pTVar17[local_38[1]].Count;
      local_48[2] = pTVar17[local_38[2]].Count;
      local_48[3] = pTVar17[local_38[3]].Count;
      lVar16 = 0;
      do {
        if (this->VertexGrid[local_38[lVar16]].Count == local_48[lVar16]) {
          pTVar17 = this->VertexGrid + local_38[lVar16];
          TArray<int,_int>::Grow(pTVar17,1);
          pTVar17->Array[pTVar17->Count] = uVar2;
          pTVar17->Count = pTVar17->Count + 1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      return uVar2;
    }
    __assert_fail("y >= MinY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild.h"
                  ,0x9e,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  __assert_fail("x >= MinX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild.h"
                ,0x9d,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
}

Assistant:

int FNodeBuilder::FVertexMap::InsertVertex (FNodeBuilder::FPrivVert &vert)
{
	int vertnum;

	vert.segs = DWORD_MAX;
	vert.segs2 = DWORD_MAX;
	vertnum = (int)MyBuilder.Vertices.Push (vert);

	// If a vertex is near a block boundary, then it will be inserted on
	// both sides of the boundary so that SelectVertexClose can find
	// it by checking in only one block.
	fixed_t minx = MAX (MinX, vert.x - VERTEX_EPSILON);
	fixed_t maxx = MIN (MaxX, vert.x + VERTEX_EPSILON);
	fixed_t miny = MAX (MinY, vert.y - VERTEX_EPSILON);
	fixed_t maxy = MIN (MaxY, vert.y + VERTEX_EPSILON);

	int blk[4] =
	{
		GetBlock (minx, miny),
		GetBlock (maxx, miny),
		GetBlock (minx, maxy),
		GetBlock (maxx, maxy)
	};
	unsigned int blkcount[4] =
	{
		VertexGrid[blk[0]].Size(),
		VertexGrid[blk[1]].Size(),
		VertexGrid[blk[2]].Size(),
		VertexGrid[blk[3]].Size()
	};
	for (int i = 0; i < 4; ++i)
	{
		if (VertexGrid[blk[i]].Size() == blkcount[i])
		{
			VertexGrid[blk[i]].Push (vertnum);
		}
	}

	return vertnum;
}